

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

string * __thiscall
Assimp::FBX::ParseTokenAsString_abi_cxx11_
          (string *__return_storage_ptr__,FBX *this,Token *t,char **err_out)

{
  bool bVar1;
  TokenType TVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  allocator local_72;
  allocator local_71;
  char *local_70;
  char *e;
  char *s;
  ulong local_58;
  size_t length;
  int local_48;
  allocator local_41;
  int32_t len;
  char *data;
  allocator local_21;
  Token *local_20;
  char **err_out_local;
  Token *t_local;
  
  t->sbegin = (char *)0x0;
  local_20 = t;
  err_out_local = (char **)this;
  t_local = (Token *)__return_storage_ptr__;
  TVar2 = Token::Type((Token *)this);
  if (TVar2 == TokenType_DATA) {
    bVar1 = Token::IsBinary((Token *)err_out_local);
    if (bVar1) {
      _len = Token::begin((Token *)err_out_local);
      if (*_len == 'S') {
        pcVar3 = _len + 1;
        pcVar4 = Token::end((Token *)err_out_local);
        local_48 = anon_unknown.dwarf_1924db::SafeParse<int>(pcVar3,pcVar4);
        pcVar3 = _len + 5;
        uVar5 = (ulong)local_48;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,pcVar3,uVar5,(allocator *)((long)&length + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&length + 7));
      }
      else {
        local_20->sbegin = "failed to parse S(tring), unexpected data type (binary)";
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_41);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
      }
    }
    else {
      pcVar3 = Token::end((Token *)err_out_local);
      pcVar4 = Token::begin((Token *)err_out_local);
      local_58 = (long)pcVar3 - (long)pcVar4;
      if (local_58 < 2) {
        local_20->sbegin = "token is too short to hold a string";
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"",(allocator *)((long)&s + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
      }
      else {
        e = Token::begin((Token *)err_out_local);
        local_70 = Token::end((Token *)err_out_local);
        local_70 = local_70 + -1;
        if ((*e == '\"') && (*local_70 == '\"')) {
          pcVar3 = e + 1;
          uVar5 = local_58 - 2;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,uVar5,&local_72);
          std::allocator<char>::~allocator((allocator<char> *)&local_72);
        }
        else {
          local_20->sbegin = "expected double quoted string";
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_71);
          std::allocator<char>::~allocator((allocator<char> *)&local_71);
        }
      }
    }
  }
  else {
    local_20->sbegin = "expected TOK_DATA token";
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ParseTokenAsString(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return "";
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'S') {
            err_out = "failed to parse S(tring), unexpected data type (binary)";
            return "";
        }

        // read string length
        BE_NCONST int32_t len = SafeParse<int32_t>(data+1, t.end());
        AI_SWAP4(len);

        ai_assert(t.end() - data == 5 + len);
        return std::string(data + 5, len);
    }

    const size_t length = static_cast<size_t>(t.end() - t.begin());
    if(length < 2) {
        err_out = "token is too short to hold a string";
        return "";
    }

    const char* s = t.begin(), *e = t.end() - 1;
    if (*s != '\"' || *e != '\"') {
        err_out = "expected double quoted string";
        return "";
    }

    return std::string(s+1,length-2);
}